

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O2

double __thiscall
PDFUsedFont::CalculateTextAdvance(PDFUsedFont *this,string *inText,double inFontSize)

{
  double dVar1;
  UIntList glyphs;
  _List_base<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  local_20._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_20;
  local_20._M_impl._M_node._M_size = 0;
  local_20._M_impl._M_node.super__List_node_base._M_prev =
       local_20._M_impl._M_node.super__List_node_base._M_next;
  GetUnicodeGlyphs(this,inText,(UIntList *)local_20._M_impl._M_node.super__List_node_base._M_next);
  dVar1 = CalculateTextAdvance(this,(UIntList *)&local_20,inFontSize);
  std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear(&local_20);
  return dVar1;
}

Assistant:

double PDFUsedFont::CalculateTextAdvance(const std::string& inText,double inFontSize)
{
	UIntList glyphs;
	GetUnicodeGlyphs(inText, glyphs);
	return CalculateTextAdvance(glyphs,inFontSize);
}